

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.cpp
# Opt level: O2

double median(vector<double,_std::allocator<double>_> *values)

{
  long lVar1;
  double dVar2;
  vector<double,_std::allocator<double>_> sorted_values;
  _Vector_base<double,_std::allocator<double>_> local_20;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_20,values);
  std::
  __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_20._M_impl.super__Vector_impl_data._M_start,
             local_20._M_impl.super__Vector_impl_data._M_finish);
  lVar1 = (long)local_20._M_impl.super__Vector_impl_data._M_finish -
          (long)local_20._M_impl.super__Vector_impl_data._M_start >> 3;
  if (((long)local_20._M_impl.super__Vector_impl_data._M_finish -
       (long)local_20._M_impl.super__Vector_impl_data._M_start & 8U) == 0) {
    dVar2 = (*(double *)((long)local_20._M_impl.super__Vector_impl_data._M_start + lVar1 * 4 + -8) +
            *(double *)((long)local_20._M_impl.super__Vector_impl_data._M_start + lVar1 * 4)) * 0.5;
  }
  else {
    dVar2 = *(double *)((long)local_20._M_impl.super__Vector_impl_data._M_start + lVar1 * 4 + -4);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_20);
  return dVar2;
}

Assistant:

double median(const std::vector<double>& values)
{
    std::vector<double> sorted_values{values};
    std::sort(sorted_values.begin(), sorted_values.end());

    if (sorted_values.size() % 2)
        return sorted_values[(sorted_values.size() - 1) / 2];
    else
        return (sorted_values[sorted_values.size() / 2 - 1] + sorted_values[sorted_values.size() / 2]) / 2.0;
}